

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O2

void __thiscall
icu_63::SameValueSubstitution::SameValueSubstitution
          (SameValueSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  int8_t iVar1;
  ConstChar16Ptr local_30 [3];
  
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SameValueSubstitution_003dfd88;
  local_30[0].p_ = L"==";
  iVar1 = UnicodeString::compare(description,local_30,2);
  if (iVar1 == '\0') {
    *status = U_PARSE_ERROR;
  }
  return;
}

Assistant:

SameValueSubstitution::SameValueSubstitution(int32_t _pos,
                        const NFRuleSet* _ruleSet,
                        const UnicodeString& description,
                        UErrorCode& status)
: NFSubstitution(_pos, _ruleSet, description, status)
{
    if (0 == description.compare(gEqualsEquals, 2)) {
        // throw new IllegalArgumentException("== is not a legal token");
        status = U_PARSE_ERROR;
    }
}